

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

EVaction INT_REVassoc_terminal_action
                   (CMConnection conn,EVstone stone,FMStructDescList format_list,char *handler)

{
  int iVar1;
  CManager_conflict cm;
  CManager cm_00;
  CManager in_RCX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  EVassoc_terminal_action_request request;
  EV_int_response response;
  CMFormat f;
  int cond;
  CMFormat in_stack_ffffffffffffffa8;
  CMConnection in_stack_ffffffffffffffb8;
  CManager in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  EVaction in_stack_ffffffffffffffcc;
  int condition;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  
  memset(&stack0xffffffffffffffb0,0,0x18);
  iVar1 = INT_CMCondition_get(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  cm = (CManager_conflict)INT_CMlookup_format((CManager)*in_RDI,EVassoc_terminal_action_req_formats)
  ;
  cm_00 = (CManager)
          get_format_name(cm,(FMStructDescList)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar2 = iVar1;
  if (cm == (CManager_conflict)0x0) {
    cm = (CManager_conflict)INT_CMregister_format(cm_00,(FMStructDescList)CONCAT44(in_ESI,iVar1));
  }
  condition = (int)((ulong)cm >> 0x20);
  INT_CMCondition_set_client_data(in_RCX,(int)((ulong)cm_00 >> 0x20),(void *)CONCAT44(in_ESI,iVar1))
  ;
  INT_CMwrite((CMConnection)CONCAT44(in_ESI,iVar1),in_stack_ffffffffffffffa8,(void *)0x155113);
  INT_CMCondition_wait((CManager)CONCAT44(iVar2,in_stack_ffffffffffffffd8),condition);
  return in_stack_ffffffffffffffcc;
}

Assistant:

extern EVaction
INT_REVassoc_terminal_action(CMConnection conn, EVstone stone, FMStructDescList format_list, char *handler)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVassoc_terminal_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVassoc_terminal_action_req_formats);
    request.stone = stone;
    request.format_list = get_format_name(conn->cm, format_list);
    request.handler = handler;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVassoc_terminal_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVaction) response.ret;
}